

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_graph.cc
# Opt level: O0

void GraphTask::setup(search *sch,multi_ex *ec)

{
  float *pfVar1;
  bool bVar2;
  uint32_t uVar3;
  vw *pvVar4;
  uint64_t uVar5;
  size_type sVar6;
  undefined8 uVar7;
  reference ppeVar8;
  size_t sVar9;
  wclass *pwVar10;
  vw_exception *pvVar11;
  ostream *pfile;
  string *pmessage;
  ostream *this;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar12;
  ulong uVar13;
  reference pvVar14;
  reference pvVar15;
  vector<example_*,_std::allocator<example_*>_> *in_RSI;
  search *in_RDI;
  size_t n_2;
  size_t nn;
  size_t n_1;
  stringstream __msg_2;
  size_t n;
  size_t i_1;
  stringstream __msg_1;
  stringstream __msg;
  size_t i;
  task_data *D;
  parameters *in_stack_fffffffffffff9d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff9e0;
  allocator_type *in_stack_fffffffffffff9e8;
  allocator_type *in_stack_fffffffffffff9f0;
  string *in_stack_fffffffffffff9f8;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_stack_fffffffffffffa00;
  int iVar16;
  char *in_stack_fffffffffffffa08;
  vw_exception *in_stack_fffffffffffffa10;
  vw_exception *this_00;
  ulong local_5a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_590;
  stringstream local_560 [16];
  stringstream local_550 [136];
  multi_ex *in_stack_fffffffffffffb38;
  task_data *in_stack_fffffffffffffb40;
  vw_exception *local_3d8;
  ulong local_3d0;
  stringstream local_368 [16];
  ostream local_358;
  undefined1 local_1d9;
  stringstream local_1a8 [16];
  ostream local_198;
  ulong local_20;
  task_data *local_18;
  vector<example_*,_std::allocator<example_*>_> *local_10;
  search *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = Search::search::get_task_data<GraphTask::task_data>(in_RDI);
  local_18->multiplier = local_18->wpp << ((byte)local_18->ss & 0x3f);
  pvVar4 = Search::search::get_vw_pointer_unsafe(local_8);
  local_18->wpp = (ulong)pvVar4->wpp;
  Search::search::get_vw_pointer_unsafe(local_8);
  uVar5 = parameters::mask(in_stack_fffffffffffff9d8);
  local_18->mask = uVar5;
  Search::search::get_vw_pointer_unsafe(local_8);
  uVar3 = parameters::stride_shift(in_stack_fffffffffffff9d8);
  local_18->ss = (ulong)uVar3;
  local_18->N = 0;
  local_18->E = 0;
  for (local_20 = 0; uVar13 = local_20,
      sVar6 = std::vector<example_*,_std::allocator<example_*>_>::size(local_10), uVar13 < sVar6;
      local_20 = local_20 + 1) {
    std::vector<example_*,_std::allocator<example_*>_>::operator[](local_10,local_20);
    bVar2 = example_is_edge((example *)0x1651d0);
    if (bVar2) {
      local_18->E = local_18->E + 1;
    }
    else {
      if (local_18->E != 0) {
        std::__cxx11::stringstream::stringstream(local_1a8);
        iVar16 = (int)((ulong)in_stack_fffffffffffffa00 >> 0x20);
        std::operator<<(&local_198,"error: got a node after getting edges!");
        local_1d9 = 1;
        uVar7 = __cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,iVar16,
                   in_stack_fffffffffffff9f8);
        local_1d9 = 0;
        __cxa_throw(uVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      local_18->N = local_18->N + 1;
      ppeVar8 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_10,local_20);
      sVar9 = v_array<COST_SENSITIVE::wclass>::size
                        ((v_array<COST_SENSITIVE::wclass> *)&((*ppeVar8)->l).simple);
      if (sVar9 != 0) {
        pfVar1 = local_18->true_counts;
        ppeVar8 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_10,local_20);
        pwVar10 = v_array<COST_SENSITIVE::wclass>::operator[]
                            ((v_array<COST_SENSITIVE::wclass> *)&((*ppeVar8)->l).simple,0);
        pfVar1[pwVar10->class_index] = pfVar1[pwVar10->class_index] + 1.0;
        local_18->true_counts_total = local_18->true_counts_total + 1.0;
      }
    }
  }
  if ((local_18->N == 0) && (local_18->E != 0)) {
    std::__cxx11::stringstream::stringstream(local_368);
    iVar16 = (int)((ulong)in_stack_fffffffffffffa00 >> 0x20);
    std::operator<<(&local_358,
                    "error: got edges without any nodes (perhaps ring_size is too small?)!");
    uVar7 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,iVar16,in_stack_fffffffffffff9f8)
    ;
    __cxa_throw(uVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x16554b);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffa00,
             (size_type)in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::allocator
            ((allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)0x165575);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(in_stack_fffffffffffffa00,(size_type)in_stack_fffffffffffff9f8,
           (value_type *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::operator=((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               *)in_stack_fffffffffffff9f0,
              (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               *)in_stack_fffffffffffff9e8);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)in_stack_fffffffffffff9f0);
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~allocator
            ((allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)0x1655c9);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff9f0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1655e3);
  local_3d0 = (ulong)local_18->N;
  do {
    sVar6 = std::vector<example_*,_std::allocator<example_*>_>::size(local_10);
    if (sVar6 <= local_3d0) {
      run_bfs(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x165a58);
      for (local_5a0 = 0; local_5a0 < local_18->N; local_5a0 = local_5a0 + 1) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (in_stack_fffffffffffff9e0,(value_type_conflict1 *)in_stack_fffffffffffff9d8);
      }
      return;
    }
    local_3d8 = (vw_exception *)0x0;
    while( true ) {
      this_00 = local_3d8;
      ppeVar8 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_10,local_3d0);
      pvVar11 = (vw_exception *)
                v_array<COST_SENSITIVE::wclass>::size
                          ((v_array<COST_SENSITIVE::wclass> *)&((*ppeVar8)->l).simple);
      if (pvVar11 <= this_00) break;
      ppeVar8 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_10,local_3d0);
      pwVar10 = v_array<COST_SENSITIVE::wclass>::operator[]
                          ((v_array<COST_SENSITIVE::wclass> *)&((*ppeVar8)->l).simple,
                           (size_t)local_3d8);
      if (local_18->N < pwVar10->class_index) {
        std::__cxx11::stringstream::stringstream(local_560);
        pfile = std::operator<<((ostream *)(local_560 + 0x10),
                                "error: edge source points to too large of a node id: ");
        ppeVar8 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_10,local_3d0)
        ;
        pwVar10 = v_array<COST_SENSITIVE::wclass>::operator[]
                            ((v_array<COST_SENSITIVE::wclass> *)&((*ppeVar8)->l).simple,
                             (size_t)local_3d8);
        pmessage = (string *)std::ostream::operator<<(pfile,pwVar10->class_index);
        iVar16 = (int)((ulong)pwVar10 >> 0x20);
        this = std::operator<<((ostream *)pmessage," > ");
        std::ostream::operator<<(this,local_18->N);
        uVar7 = __cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception(this_00,(char *)pfile,iVar16,pmessage);
        __cxa_throw(uVar7,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      local_3d8 = (vw_exception *)&local_3d8->field_0x1;
    }
    local_590 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
    while( true ) {
      in_stack_fffffffffffff9e0 = local_590;
      ppeVar8 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_10,local_3d0);
      pvVar12 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                v_array<COST_SENSITIVE::wclass>::size
                          ((v_array<COST_SENSITIVE::wclass> *)&((*ppeVar8)->l).simple);
      if (pvVar12 <= in_stack_fffffffffffff9e0) break;
      ppeVar8 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_10,local_3d0);
      pwVar10 = v_array<COST_SENSITIVE::wclass>::operator[]
                          ((v_array<COST_SENSITIVE::wclass> *)&((*ppeVar8)->l).simple,
                           (size_t)local_590);
      uVar13 = (ulong)pwVar10->class_index;
      if (uVar13 != 0) {
        pvVar14 = std::
                  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::operator[](&local_18->adj,uVar13 - 1);
        sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar14);
        if (sVar6 != 0) {
          in_stack_fffffffffffff9d8 =
               (parameters *)
               std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[](&local_18->adj,uVar13 - 1);
          pvVar14 = std::
                    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ::operator[](&local_18->adj,uVar13 - 1);
          sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar14);
          pvVar15 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               in_stack_fffffffffffff9d8,sVar6 - 1);
          if (*pvVar15 == local_3d0) goto LAB_001659fc;
        }
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::operator[](&local_18->adj,uVar13 - 1);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffff9f0,(value_type_conflict1 *)in_stack_fffffffffffff9e8);
      }
LAB_001659fc:
      local_590 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  ((long)&(local_590->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start + 1);
    }
    local_3d0 = local_3d0 + 1;
  } while( true );
}

Assistant:

void setup(Search::search& sch, multi_ex& ec)
{
  task_data& D = *sch.get_task_data<task_data>();
  D.multiplier = D.wpp << D.ss;
  D.wpp = sch.get_vw_pointer_unsafe().wpp;
  D.mask = sch.get_vw_pointer_unsafe().weights.mask();
  D.ss = sch.get_vw_pointer_unsafe().weights.stride_shift();
  D.N = 0;
  D.E = 0;
  for (size_t i = 0; i < ec.size(); i++)
    if (example_is_edge(ec[i]))
      D.E++;
    else  // it's a node!
    {
      if (D.E > 0)
        THROW("error: got a node after getting edges!");

      D.N++;
      if (ec[i]->l.cs.costs.size() > 0)
      {
        D.true_counts[ec[i]->l.cs.costs[0].class_index] += 1.;
        D.true_counts_total += 1.;
      }
    }

  if ((D.N == 0) && (D.E > 0))
    THROW("error: got edges without any nodes (perhaps ring_size is too small?)!");

  D.adj = vector<vector<size_t>>(D.N, vector<size_t>(0));

  for (size_t i = D.N; i < ec.size(); i++)
  {
    for (size_t n = 0; n < ec[i]->l.cs.costs.size(); n++)
    {
      if (ec[i]->l.cs.costs[n].class_index > D.N)
        THROW("error: edge source points to too large of a node id: " << (ec[i]->l.cs.costs[n].class_index) << " > "
                                                                      << D.N);
    }
    for (size_t n = 0; n < ec[i]->l.cs.costs.size(); n++)
    {
      size_t nn = ec[i]->l.cs.costs[n].class_index;
      if ((nn > 0) &&
          (((D.adj[nn - 1].size() == 0) || (D.adj[nn - 1][D.adj[nn - 1].size() - 1] != i))))  // don't allow dups
        D.adj[nn - 1].push_back(i);
    }
  }

  run_bfs(D, ec);

  D.pred.clear();
  for (size_t n = 0; n < D.N; n++) D.pred.push_back(D.K + 1);
}